

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

value_type *
duckdb::Exception::ConstructMessageRecursive<duckdb::ParquetVersion>
          (string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,ParquetVersion param)

{
  vector *in_RSI;
  value_type *in_RDI;
  value_type *this;
  
  this = in_RDI;
  ExceptionFormatValue::CreateFormatValue<duckdb::ParquetVersion>
            ((ParquetVersion)((ulong)in_RDI >> 0x38));
  std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  push_back((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
            this,in_RDI);
  ExceptionFormatValue::~ExceptionFormatValue((ExceptionFormatValue *)0x6803b4);
  duckdb::Exception::ConstructMessageRecursive((string *)in_RDI,in_RSI);
  return this;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}